

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprintint.h
# Opt level: O2

int print_uint64(uint64_t n,char *p)

{
  int iVar1;
  uint64_t uVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  
  if (n < 1000000000) {
    iVar1 = print_uint32((uint32_t)n,p);
    return iVar1;
  }
  if (n >> 0xd < 0x48c27395) {
    if (n >> 0xb < 0x2e90edd) {
      bVar5 = n >> 10 < 0x9502f9;
      iVar1 = 10;
    }
    else {
      bVar5 = n >> 0xc < 0xe8d4a51;
      iVar1 = 0xc;
    }
    uVar3 = (ulong)((iVar1 + 1) - (uint)bVar5);
LAB_0011a219:
    iVar1 = (int)uVar3;
    pcVar4 = p + uVar3;
    p[uVar3] = '\0';
    if ((uVar3 & 1) != 0) {
      uVar2 = n;
      switch(iVar1) {
      case 0x13:
        uVar2 = n / 100;
        *(undefined2 *)(pcVar4 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (n % 100) * 2);
        pcVar4 = pcVar4 + -2;
      case 0x11:
        n = uVar2 / 100;
        *(undefined2 *)(pcVar4 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (uVar2 % 100) * 2);
        pcVar4 = pcVar4 + -2;
      case 0xf:
        uVar2 = n / 100;
        *(undefined2 *)(pcVar4 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (n % 100) * 2);
        pcVar4 = pcVar4 + -2;
      case 0xd:
        n = uVar2 / 100;
        *(undefined2 *)(pcVar4 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (uVar2 % 100) * 2);
        pcVar4 = pcVar4 + -2;
      case 0xb:
        *(undefined2 *)(pcVar4 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (n % 100) * 2);
        pcVar4[-3] = (byte)((n / 100) % 10) | 0x30;
        pcVar4 = pcVar4 + -3;
        n = n / 1000;
      }
      goto switchD_0011a246_caseD_b;
    }
    uVar2 = n;
    switch(iVar1) {
    default:
      goto switchD_0011a246_caseD_b;
    case 0xc:
switchD_0011a246_caseD_c:
      uVar2 = n / 100;
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (n % 100) * 2);
      pcVar4 = pcVar4 + -2;
    case 10:
      n = uVar2 / 100;
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar2 % 100) * 2);
      pcVar4 = pcVar4 + -2;
switchD_0011a246_caseD_b:
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (n % 100) * 2);
      *(undefined2 *)(pcVar4 + -4) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + ((n / 100) % 100) * 2);
      *(undefined2 *)(pcVar4 + -6) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + ((n / 10000) % 100) * 2);
      *(undefined2 *)(pcVar4 + -8) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + ((n / 1000000) % 100) * 2);
      return iVar1;
    case 0xe:
      goto switchD_0011a246_caseD_e;
    case 0x10:
      break;
    case 0x14:
      uVar2 = n / 100;
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (n % 100) * 2);
      pcVar4 = pcVar4 + -2;
    case 0x12:
      n = uVar2 / 100;
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar2 % 100) * 2);
      pcVar4 = pcVar4 + -2;
    }
  }
  else {
    if (9999999999999999 < n) {
      if (n < 1000000000000000000) {
        uVar3 = (ulong)((99999999999999999 < n) + 0x11);
      }
      else {
        uVar3 = (ulong)((9999999999999999999 < n) + 0x13);
      }
      goto LAB_0011a219;
    }
    if (n < 1000000000000000) {
      uVar3 = (ulong)(99999999999999 < n | 0xe);
      goto LAB_0011a219;
    }
    p[0x10] = '\0';
    pcVar4 = p + 0x10;
    iVar1 = 0x10;
  }
  uVar2 = n / 100;
  *(undefined2 *)(pcVar4 + -2) =
       *(undefined2 *)
        (
        "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
        + (n % 100) * 2);
  pcVar4 = pcVar4 + -2;
switchD_0011a246_caseD_e:
  n = uVar2 / 100;
  *(undefined2 *)(pcVar4 + -2) =
       *(undefined2 *)
        (
        "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
        + (uVar2 % 100) * 2);
  pcVar4 = pcVar4 + -2;
  goto switchD_0011a246_caseD_c;
}

Assistant:

static int print_uint64(uint64_t n, char *p)
{
    int k = 0;
    const char *dp;
    const uint64_t x = 1000000000ULL;

    if (n < x) {
        return print_uint32((uint32_t)n, p);
    }
    if(n >= 10000ULL * x) {
        if(n >= 10000000ULL * x) {
            if(n >= 1000000000ULL * x) {
                if (n >= 10000000000ULL * x) {
                    k = 11 + 9;
                } else {
                    k = 10 + 9;
                }
            } else if(n >= 100000000ULL * x) {
                k = 9 + 9;
            } else {
               k = 8 + 9;
            }
        } else {
            if(n >= 1000000ULL * x) {
                k = 7 + 9;
            } else if(n >= 100000ULL * x) {
                k = 6 + 9;
            } else {
                k = 5 + 9;
            }
        }
    } else {
        if(n >= 100ULL * x) {
            if(n >= 1000ULL * x) {
                k = 4 + 9;
            } else {
                k = 3 + 9;
            }
        } else {
            if(n >= 10ULL * x) {
                k = 2 + 9;
            } else {
                k = 1 + 9;
            }
        }
    }
    p += k;
    *p = '\0';
    if (k & 1) {
        switch (k) {
        case 19:
            __print_stage();
	    pattribute(fallthrough);
        case 17:
            __print_stage();
	    pattribute(fallthrough);
        case 15:
            __print_stage();
	    pattribute(fallthrough);
        case 13:
            __print_stage();
	    pattribute(fallthrough);
        case 11:
            __print_stage()
            __print_short_stage();
        }
    } else {
        switch (k) {
        case 20:
            __print_stage();
	    pattribute(fallthrough);
        case 18:
            __print_stage();
	    pattribute(fallthrough);
        case 16:
            __print_stage();
	    pattribute(fallthrough);
        case 14:
            __print_stage();
	    pattribute(fallthrough);
        case 12:
            __print_stage();
	    pattribute(fallthrough);
        case 10:
            __print_stage();
        }
    }
    __print_long_stage()
    __print_long_stage()
    return k;
}